

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cc
# Opt level: O0

void __thiscall
RVO::KdTree::queryAgentTreeRecursive(KdTree *this,Agent *agent,float *rangeSq,size_t node)

{
  const_reference pAVar1;
  size_t sVar2;
  float *pfVar3;
  float *in_RCX;
  Agent *in_RDX;
  KdTree *in_RSI;
  vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *in_RDI;
  float fVar4;
  float distSqRight;
  float distRightMaxY;
  float distRightMinY;
  float distRightMaxX;
  float distRightMinX;
  float distSqLeft;
  float distLeftMaxY;
  float distLeftMinY;
  float distLeftMaxX;
  float distLeftMinX;
  size_t i;
  float *in_stack_fffffffffffffed0;
  vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *pvVar5;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  Agent *in_stack_fffffffffffffee0;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  size_t in_stack_ffffffffffffffd8;
  ulong __n;
  
  pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
           operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                       *)(in_RDI + 1),(size_type)in_RCX);
  sVar2 = pAVar1->end;
  pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
           operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                       *)(in_RDI + 1),(size_type)in_RCX);
  if (sVar2 - pAVar1->begin < 0xb) {
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),(size_type)in_RCX);
    sVar2 = pAVar1->begin;
    while (__n = sVar2,
          pAVar1 = std::
                   vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
                   operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                               *)(in_RDI + 1),(size_type)in_RCX), sVar2 < pAVar1->end) {
      std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[](in_RDI,__n);
      Agent::insertAgentNeighbor
                (in_stack_fffffffffffffee0,
                 (Agent *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed0);
      sVar2 = __n + 1;
    }
  }
  else {
    local_30 = 0.0;
    pvVar5 = in_RDI + 1;
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),(size_type)in_RCX);
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)pvVar5,pAVar1->left);
    fVar4 = pAVar1->minX;
    local_34 = Vector2::x((Vector2 *)
                          &in_RSI[1].agents_.
                           super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    local_34 = fVar4 - local_34;
    pfVar3 = std::max<float>(&local_30,&local_34);
    local_2c = *pfVar3;
    local_3c = 0.0;
    fVar4 = Vector2::x((Vector2 *)
                       &in_RSI[1].agents_.
                        super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pvVar5 = in_RDI + 1;
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),(size_type)in_RCX);
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)pvVar5,pAVar1->left);
    local_40 = fVar4 - pAVar1->maxX;
    pfVar3 = std::max<float>(&local_3c,&local_40);
    local_38 = *pfVar3;
    local_48 = 0.0;
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),(size_type)in_RCX);
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),pAVar1->left);
    fVar4 = pAVar1->minY;
    local_4c = Vector2::y((Vector2 *)
                          &in_RSI[1].agents_.
                           super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    local_4c = fVar4 - local_4c;
    pfVar3 = std::max<float>(&local_48,&local_4c);
    local_44 = *pfVar3;
    local_54 = 0.0;
    fVar4 = Vector2::y((Vector2 *)
                       &in_RSI[1].agents_.
                        super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),(size_type)in_RCX);
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),pAVar1->left);
    local_58 = fVar4 - pAVar1->maxY;
    pfVar3 = std::max<float>(&local_54,&local_58);
    local_50 = *pfVar3;
    local_5c = local_50 * local_50 + local_44 * local_44 + local_2c * local_2c + local_38 * local_38
    ;
    local_64 = 0.0;
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),(size_type)in_RCX);
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),pAVar1->right);
    fVar4 = pAVar1->minX;
    local_68 = Vector2::x((Vector2 *)
                          &in_RSI[1].agents_.
                           super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    local_68 = fVar4 - local_68;
    pfVar3 = std::max<float>(&local_64,&local_68);
    local_60 = *pfVar3;
    local_70 = 0.0;
    fVar4 = Vector2::x((Vector2 *)
                       &in_RSI[1].agents_.
                        super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),(size_type)in_RCX);
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),pAVar1->right);
    local_74 = fVar4 - pAVar1->maxX;
    pfVar3 = std::max<float>(&local_70,&local_74);
    local_6c = *pfVar3;
    local_7c = 0.0;
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),(size_type)in_RCX);
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),pAVar1->right);
    fVar4 = pAVar1->minY;
    local_80 = Vector2::y((Vector2 *)
                          &in_RSI[1].agents_.
                           super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    local_80 = fVar4 - local_80;
    pfVar3 = std::max<float>(&local_7c,&local_80);
    local_78 = *pfVar3;
    local_88 = 0.0;
    fVar4 = Vector2::y((Vector2 *)
                       &in_RSI[1].agents_.
                        super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),(size_type)in_RCX);
    pAVar1 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                         *)(in_RDI + 1),pAVar1->right);
    local_8c = fVar4 - pAVar1->maxY;
    pfVar3 = std::max<float>(&local_88,&local_8c);
    local_84 = *pfVar3;
    fVar4 = local_84 * local_84 + local_78 * local_78 + local_60 * local_60 + local_6c * local_6c;
    if (fVar4 <= local_5c) {
      if (fVar4 < *(float *)&(in_RDX->agentNeighbors_).
                             super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) {
        std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
        operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                    *)(in_RDI + 1),(size_type)in_RCX);
        queryAgentTreeRecursive(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
        if (local_5c <
            *(float *)&(in_RDX->agentNeighbors_).
                       super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
          std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
          operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                      *)(in_RDI + 1),(size_type)in_RCX);
          queryAgentTreeRecursive(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
        }
      }
    }
    else if (local_5c <
             *(float *)&(in_RDX->agentNeighbors_).
                        super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
      std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
      operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_> *)
                 (in_RDI + 1),(size_type)in_RCX);
      queryAgentTreeRecursive(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      if (fVar4 < *(float *)&(in_RDX->agentNeighbors_).
                             super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) {
        std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
        operator[]((vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                    *)(in_RDI + 1),(size_type)in_RCX);
        queryAgentTreeRecursive(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      }
    }
  }
  return;
}

Assistant:

void KdTree::queryAgentTreeRecursive(Agent *agent, float &rangeSq,
                                     std::size_t node) const {
  if (agentTree_[node].end - agentTree_[node].begin <= RVO_MAX_LEAF_SIZE) {
    for (std::size_t i = agentTree_[node].begin; i < agentTree_[node].end;
         ++i) {
      agent->insertAgentNeighbor(agents_[i], rangeSq);
    }
  } else {
    const float distLeftMinX = std::max(
        0.0F, agentTree_[agentTree_[node].left].minX - agent->position_.x());
    const float distLeftMaxX = std::max(
        0.0F, agent->position_.x() - agentTree_[agentTree_[node].left].maxX);
    const float distLeftMinY = std::max(
        0.0F, agentTree_[agentTree_[node].left].minY - agent->position_.y());
    const float distLeftMaxY = std::max(
        0.0F, agent->position_.y() - agentTree_[agentTree_[node].left].maxY);

    const float distSqLeft =
        distLeftMinX * distLeftMinX + distLeftMaxX * distLeftMaxX +
        distLeftMinY * distLeftMinY + distLeftMaxY * distLeftMaxY;

    const float distRightMinX = std::max(
        0.0F, agentTree_[agentTree_[node].right].minX - agent->position_.x());
    const float distRightMaxX = std::max(
        0.0F, agent->position_.x() - agentTree_[agentTree_[node].right].maxX);
    const float distRightMinY = std::max(
        0.0F, agentTree_[agentTree_[node].right].minY - agent->position_.y());
    const float distRightMaxY = std::max(
        0.0F, agent->position_.y() - agentTree_[agentTree_[node].right].maxY);

    const float distSqRight =
        distRightMinX * distRightMinX + distRightMaxX * distRightMaxX +
        distRightMinY * distRightMinY + distRightMaxY * distRightMaxY;

    if (distSqLeft < distSqRight) {
      if (distSqLeft < rangeSq) {
        queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].left);

        if (distSqRight < rangeSq) {
          queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].right);
        }
      }
    } else if (distSqRight < rangeSq) {
      queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].right);

      if (distSqLeft < rangeSq) {
        queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].left);
      }
    }
  }
}